

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O1

bool libwebm::vttdemux::OpenFiles(metadata_map_t *metadata_map,char *filename)

{
  _Rb_tree_node_base *p_Var1;
  mapped_type *pmVar2;
  FILE *pFVar3;
  _Self __tmp;
  _Rb_tree_node_base *p_Var4;
  _Self __tmp_1;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_header *p_Var6;
  bool bVar7;
  Type type_1;
  string name;
  map<libwebm::vttdemux::MetadataInfo::Type,_int,_std::less<libwebm::vttdemux::MetadataInfo::Type>,_std::allocator<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>_>
  exists;
  Type type;
  key_type local_c4;
  char *local_c0 [2];
  char local_b0 [16];
  char *local_a0;
  char *local_98;
  _Rb_tree_node_base *local_90;
  _Rb_tree<libwebm::vttdemux::MetadataInfo::Type,_std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>,_std::_Select1st<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>,_std::less<libwebm::vttdemux::MetadataInfo::Type>,_std::allocator<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>_>
  local_88;
  key_type local_58 [10];
  
  if (metadata_map != (metadata_map_t *)0x0) {
    if (filename == (char *)0x0) {
      return false;
    }
    if ((metadata_map->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
      return false;
    }
    local_98 = strrchr(filename,0x2e);
    if (local_98 != (char *)0x0) {
      local_88._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_88._M_impl.super__Rb_tree_header._M_header;
      local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var5 = (metadata_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var6 = &(metadata_map->_M_t)._M_impl.super__Rb_tree_header;
      local_a0 = filename;
      local_88._M_impl.super__Rb_tree_header._M_header._M_right =
           local_88._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)p_Var5 != p_Var6) {
        p_Var4 = p_Var5;
        do {
          p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
          local_58[0] = *(key_type *)&p_Var4[1]._M_parent;
          pmVar2 = std::
                   map<libwebm::vttdemux::MetadataInfo::Type,_int,_std::less<libwebm::vttdemux::MetadataInfo::Type>,_std::allocator<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>_>
                   ::operator[]((map<libwebm::vttdemux::MetadataInfo::Type,_int,_std::less<libwebm::vttdemux::MetadataInfo::Type>,_std::allocator<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>_>
                                 *)&local_88,local_58);
          *pmVar2 = *pmVar2 + 1;
          p_Var4 = p_Var1;
        } while ((_Rb_tree_header *)p_Var1 != p_Var6);
      }
      bVar7 = (_Rb_tree_header *)p_Var5 == p_Var6;
      if (!bVar7) {
        do {
          local_90 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
          local_c4 = *(key_type *)&p_Var5[1]._M_parent;
          local_c0[0] = local_b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,local_a0,local_98);
          if (kChapters < local_c4) {
LAB_0010c90b:
            if (local_c0[0] != local_b0) {
              operator_delete(local_c0[0]);
            }
            break;
          }
          std::__cxx11::string::append((char *)local_c0);
          pmVar2 = std::
                   map<libwebm::vttdemux::MetadataInfo::Type,_int,_std::less<libwebm::vttdemux::MetadataInfo::Type>,_std::allocator<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>_>
                   ::operator[]((map<libwebm::vttdemux::MetadataInfo::Type,_int,_std::less<libwebm::vttdemux::MetadataInfo::Type>,_std::allocator<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>_>
                                 *)&local_88,&local_c4);
          if (1 < *pmVar2) {
            snprintf((char *)local_58,0x21,"%ld",*(undefined8 *)(p_Var5 + 1));
            std::__cxx11::string::append((char *)local_c0);
          }
          std::__cxx11::string::append((char *)local_c0);
          pFVar3 = fopen(local_c0[0],"wb");
          p_Var5[1]._M_left = (_Base_ptr)pFVar3;
          if (pFVar3 == (FILE *)0x0) {
            printf("unable to open output file %s\n");
            goto LAB_0010c90b;
          }
          if (local_c0[0] != local_b0) {
            operator_delete(local_c0[0]);
          }
          bVar7 = (_Rb_tree_header *)local_90 == p_Var6;
          p_Var5 = local_90;
        } while (!bVar7);
      }
      std::
      _Rb_tree<libwebm::vttdemux::MetadataInfo::Type,_std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>,_std::_Select1st<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>,_std::less<libwebm::vttdemux::MetadataInfo::Type>,_std::allocator<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>_>
      ::~_Rb_tree(&local_88);
      return bVar7;
    }
  }
  return false;
}

Assistant:

bool vttdemux::OpenFiles(metadata_map_t* metadata_map, const char* filename) {
  if (metadata_map == NULL || metadata_map->empty())
    return false;

  if (filename == NULL)
    return false;

  // Find the position of the filename extension.  We synthesize the
  // output filename from the directory path and basename of the input
  // filename.

  const char* const ext = strrchr(filename, '.');

  if (ext == NULL)  // TODO(matthewjheaney): liberalize?
    return false;

  // Remember whether a track of this type has already been seen (the
  // map key) by keeping a count (the map item).  We quality the
  // output filename with the track number if there is more than one
  // track having a given type.

  std::map<MetadataInfo::Type, int> exists;

  typedef metadata_map_t::iterator iter_t;

  metadata_map_t& m = *metadata_map;
  const iter_t ii = m.begin();
  const iter_t j = m.end();

  // Make a first pass over the cache to determine whether there is
  // more than one track corresponding to a given metadata type.

  iter_t i = ii;
  while (i != j) {
    const metadata_map_t::value_type& v = *i++;
    const MetadataInfo& info = v.second;
    const MetadataInfo::Type type = info.type;
    ++exists[type];
  }

  // Make a second pass over the cache, synthesizing the filename of
  // each output file (from the input file basename, the input track
  // metadata type, and its track number if necessary), and then
  // opening a WebVTT output file having that filename.

  i = ii;
  while (i != j) {
    metadata_map_t::value_type& v = *i++;
    MetadataInfo& info = v.second;
    const MetadataInfo::Type type = info.type;

    // Start with the basename of the input file.

    string name(filename, ext);

    // Next append the metadata kind.

    switch (type) {
      case MetadataInfo::kSubtitles:
        name += "_SUBTITLES";
        break;

      case MetadataInfo::kCaptions:
        name += "_CAPTIONS";
        break;

      case MetadataInfo::kDescriptions:
        name += "_DESCRIPTIONS";
        break;

      case MetadataInfo::kMetadata:
        name += "_METADATA";
        break;

      case MetadataInfo::kChapters:
        name += "_CHAPTERS";
        break;

      default:
        return false;
    }

    // If there is more than one metadata track having a given type
    // (the WebVTT-in-WebM spec doesn't preclude this), then qualify
    // the output filename with the input track number.

    if (exists[type] > 1) {
      enum { kLen = 33 };
      char str[kLen];  // max 126 tracks, so only 4 chars really needed
#ifndef _MSC_VER
      snprintf(str, kLen, "%ld", v.first);  // track number
#else
      _snprintf_s(str, sizeof(str), kLen, "%ld", v.first);  // track number
#endif
      name += str;
    }

    // Finally append the output filename extension.

    name += ".vtt";

    // We have synthesized the full output filename, so attempt to
    // open the WebVTT output file.

    info.file = fopen(name.c_str(), "wb");
    const bool success = (info.file != NULL);

    if (!success) {
      printf("unable to open output file %s\n", name.c_str());
      return false;
    }
  }

  return true;
}